

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLDateTime.cpp
# Opt level: O1

void __thiscall xercesc_4_0::XMLDateTime::parseDay(XMLDateTime *this)

{
  int iVar1;
  SchemaDateTimeException *this_00;
  XMLCh *pXVar2;
  
  pXVar2 = this->fBuffer;
  if ((pXVar2 == (XMLCh *)0x0) || (*pXVar2 == L'\0')) {
    this_00 = (SchemaDateTimeException *)__cxa_allocate_exception(0x30);
    pXVar2 = this->fBuffer;
    if (pXVar2 == (XMLCh *)0x0) {
      pXVar2 = L"";
    }
    SchemaDateTimeException::SchemaDateTimeException
              (this_00,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLDateTime.cpp"
               ,0x29a,DateTime_gDay_invalid,pXVar2,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0,
               this->fMemoryManager);
  }
  else {
    this->fStart = 0;
    if (((*pXVar2 == L'-') && (pXVar2[1] == L'-')) && (pXVar2[2] == L'-')) {
      this->fValue[0] = 2000;
      this->fValue[1] = 1;
      iVar1 = parseInt(this,this->fStart + 3,this->fStart + 5);
      this->fValue[2] = iVar1;
      if (5 < this->fEnd) {
        iVar1 = XMLString::indexOf(L"Z+-",this->fBuffer[5]);
        if (iVar1 == -1) {
          this_00 = (SchemaDateTimeException *)__cxa_allocate_exception(0x30);
          SchemaDateTimeException::SchemaDateTimeException
                    (this_00,
                     "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLDateTime.cpp"
                     ,0x2b3,DateTime_gDay_invalid,this->fBuffer,(XMLCh *)0x0,(XMLCh *)0x0,
                     (XMLCh *)0x0,this->fMemoryManager);
          goto LAB_00254499;
        }
        this->fValue[7] = iVar1 + 1;
        getTimeZone(this,5);
      }
      validateDateTime(this);
      normalize(this);
      return;
    }
    this_00 = (SchemaDateTimeException *)__cxa_allocate_exception(0x30);
    SchemaDateTimeException::SchemaDateTimeException
              (this_00,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLDateTime.cpp"
               ,0x2a3,DateTime_gDay_invalid,this->fBuffer,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0,
               this->fMemoryManager);
  }
LAB_00254499:
  __cxa_throw(this_00,&SchemaDateTimeException::typeinfo,XMLException::~XMLException);
}

Assistant:

void XMLDateTime::parseDay()
{
    if (!initParser())
        ThrowXMLwithMemMgr1(SchemaDateTimeException
                , XMLExcepts::DateTime_gDay_invalid
                , fBuffer ? fBuffer : XMLUni::fgZeroLenString
                , fMemoryManager);

    if (fBuffer[0] != DATE_SEPARATOR ||
        fBuffer[1] != DATE_SEPARATOR ||
        fBuffer[2] != DATE_SEPARATOR  )
    {
        ThrowXMLwithMemMgr1(SchemaDateTimeException
                , XMLExcepts::DateTime_gDay_invalid
                , fBuffer
                , fMemoryManager);
    }

    //initialize values
    fValue[CentYear] = YEAR_DEFAULT;
    fValue[Month]    = MONTH_DEFAULT;
    fValue[Day]      = parseInt(fStart+3, fStart+5);

    if ( DAY_SIZE < fEnd )
    {
        int pos = XMLString::indexOf(UTC_SET, fBuffer[DAY_SIZE]);
        if (pos == -1 )
        {
            ThrowXMLwithMemMgr1(SchemaDateTimeException
                    , XMLExcepts::DateTime_gDay_invalid
                    , fBuffer
                    , fMemoryManager);
        }
        else
        {
            fValue[utc] = pos+1;
            getTimeZone(DAY_SIZE);
        }
    }

    validateDateTime();
    normalize();
}